

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O3

void __thiscall HMISong::HMISong(HMISong *this,HMISong *original,char *filename,EMidiDevice type)

{
  int iVar1;
  int iVar2;
  BYTE *__src;
  TrackInfo *pTVar3;
  undefined1 auVar4 [16];
  BYTE *__dest;
  TrackInfo *pTVar5;
  long lVar6;
  ulong uVar7;
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,filename,type);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__HMISong_006f0618;
  (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array = (AutoNoteOff *)0x0;
  (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Most = 0;
  (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count = 0;
  iVar1 = original->SongLen;
  this->SongLen = iVar1;
  __dest = (BYTE *)operator_new__((long)iVar1);
  this->MusHeader = __dest;
  __src = original->MusHeader;
  memcpy(__dest,__src,(long)iVar1);
  iVar1 = original->NumTracks;
  this->NumTracks = iVar1;
  (this->super_MIDIStreamer).Division = (original->super_MIDIStreamer).Division;
  iVar2 = (original->super_MIDIStreamer).InitialTempo;
  (this->super_MIDIStreamer).InitialTempo = iVar2;
  (this->super_MIDIStreamer).Tempo = iVar2;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)iVar1;
  uVar7 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x38),8) == 0) {
    uVar7 = SUB168(auVar4 * ZEXT816(0x38),0);
  }
  pTVar5 = (TrackInfo *)operator_new__(uVar7);
  this->Tracks = pTVar5;
  if (0 < iVar1) {
    pTVar3 = original->Tracks;
    lVar6 = 0;
    do {
      *(BYTE **)((long)pTVar5->Designation + lVar6 + -0x20) =
           __dest + (*(long *)((long)pTVar3->Designation + lVar6 + -0x20) - (long)__src);
      *(undefined8 *)((long)pTVar5->Designation + lVar6 + -0x18) = 0;
      *(undefined8 *)((long)pTVar5->Designation + lVar6 + -0x10) =
           *(undefined8 *)((long)pTVar3->Designation + lVar6 + -0x10);
      lVar6 = lVar6 + 0x38;
    } while ((long)iVar1 * 0x38 - lVar6 != 0);
  }
  return;
}

Assistant:

HMISong::HMISong(const HMISong *original, const char *filename, EMidiDevice type)
: MIDIStreamer(filename, type)
{
	SongLen = original->SongLen;
	MusHeader = new BYTE[original->SongLen];
	memcpy(MusHeader, original->MusHeader, original->SongLen);
	NumTracks = original->NumTracks;
	Division = original->Division;
	Tempo = InitialTempo = original->InitialTempo;
	Tracks = new TrackInfo[NumTracks];
	for (int i = 0; i < NumTracks; ++i)
	{
		TrackInfo *newtrack = &Tracks[i];
		const TrackInfo *oldtrack = &original->Tracks[i];

		newtrack->TrackBegin = MusHeader + (oldtrack->TrackBegin - original->MusHeader);
		newtrack->TrackP = 0;
		newtrack->MaxTrackP = oldtrack->MaxTrackP;
	}
}